

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  undefined1 *puVar1;
  secp256k1_strauss_point_state *psVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  secp256k1_scratch_space *scratch;
  ulong extraout_RAX;
  code *pcVar6;
  long lVar7;
  secp256k1_scalar *ng;
  secp256k1_ge *psVar8;
  ulong uVar9;
  secp256k1_ge *scratch_00;
  size_t sVar10;
  secp256k1_gej *r;
  ulong uVar11;
  byte *out32;
  secp256k1_ge *b;
  secp256k1_gej *a;
  uchar *p2;
  code *cb;
  secp256k1_ge *cbdata;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *psVar12;
  secp256k1_sha256 *psVar13;
  secp256k1_sha256 *hash;
  uchar inp [6];
  uchar b32 [32];
  ulong uStack_1750;
  secp256k1_strauss_state sStack_1740;
  secp256k1_strauss_point_state sStack_1728;
  secp256k1_fe asStack_1318 [8];
  secp256k1_ge asStack_1198 [8];
  secp256k1_gej *psStack_e50;
  secp256k1_callback *psStack_e48;
  secp256k1_ge *psStack_e38;
  secp256k1_strauss_point_state *psStack_e30;
  secp256k1_scalar *psStack_e28;
  undefined1 auStack_e10 [8];
  undefined1 auStack_e08 [176];
  secp256k1_gej sStack_d58;
  secp256k1_gej sStack_cc0;
  secp256k1_gej sStack_c28;
  secp256k1_gej sStack_b90;
  secp256k1_gej sStack_af8;
  secp256k1_gej asStack_a60 [2];
  secp256k1_gej asStack_8e0 [5];
  secp256k1_strauss_point_state sStack_5a0;
  secp256k1_scratch_space *psStack_188;
  secp256k1_sha256 *psStack_180;
  secp256k1_sha256 *psStack_178;
  secp256k1_scalar *psStack_170;
  size_t sStack_168;
  code *pcStack_160;
  uint32_t local_156;
  undefined2 local_152;
  uchar *local_150;
  byte local_148 [32];
  secp256k1_scalar local_128;
  secp256k1_sha256 local_108;
  secp256k1_sha256 local_98;
  
  out32 = (byte *)(ulong)prefix;
  pcStack_160 = (code *)0x14faa7;
  local_150 = expected32;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  psVar12 = &local_98;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  psVar13 = (secp256k1_sha256 *)0x0;
  local_98.bytes = 0;
  local_128.d[0] = 0;
  local_128.d[1] = 0;
  local_128.d[2] = 0;
  local_128.d[3] = 0;
  pcStack_160 = (code *)0x14faee;
  local_156 = prefix;
  secp256k1_scalar_verify(&local_128);
  pcStack_160 = (code *)0x14fafc;
  test_ecmult_accumulate(psVar12,&local_128,scratch);
  local_128.d[0] = 1;
  local_128.d[1] = 0;
  local_128.d[2] = 0;
  local_128.d[3] = 0;
  pcStack_160 = (code *)0x14fb17;
  secp256k1_scalar_verify(&local_128);
  pcStack_160 = (code *)0x14fb25;
  test_ecmult_accumulate(psVar12,&local_128,scratch);
  pcStack_160 = (code *)0x14fb30;
  secp256k1_scalar_negate(&local_128,&local_128);
  pcStack_160 = (code *)0x14fb3e;
  test_ecmult_accumulate(psVar12,&local_128,scratch);
  if (iter != 0) {
    psVar12 = (secp256k1_sha256 *)0x0;
    psVar13 = &local_108;
    out32 = local_148;
    do {
      local_152 = SUB82(psVar12,0);
      local_108.s[0] = 0x6a09e667;
      local_108.s[1] = 0xbb67ae85;
      local_108.s[2] = 0x3c6ef372;
      local_108.s[3] = 0xa54ff53a;
      local_108.s[4] = 0x510e527f;
      local_108.s[5] = 0x9b05688c;
      local_108.s[6] = 0x1f83d9ab;
      local_108.s[7] = 0x5be0cd19;
      local_108.bytes = 0;
      pcStack_160 = (code *)0x14fb95;
      secp256k1_sha256_write(psVar13,(uchar *)&local_156,6);
      pcStack_160 = (code *)0x14fba0;
      secp256k1_sha256_finalize(psVar13,out32);
      pcStack_160 = (code *)0x14fbad;
      secp256k1_scalar_set_b32(&local_128,out32,(int *)0x0);
      pcStack_160 = (code *)0x14fbc0;
      test_ecmult_accumulate(&local_98,&local_128,scratch);
      psVar12 = (secp256k1_sha256 *)((long)psVar12->s + 1);
    } while ((secp256k1_sha256 *)iter != psVar12);
  }
  pcStack_160 = (code *)0x14fbda;
  secp256k1_sha256_finalize(&local_98,local_148);
  lVar7 = 0;
  uVar11 = extraout_RAX;
  do {
    uVar9 = uVar11 & 0xffffffff;
    bVar3 = local_148[lVar7];
    psVar8 = (secp256k1_ge *)(ulong)bVar3;
    bVar4 = local_150[lVar7];
    hash = (secp256k1_sha256 *)(ulong)bVar4;
    uVar11 = (ulong)((uint)bVar3 - (uint)bVar4);
    if (bVar3 == bVar4) {
      uVar11 = uVar9;
    }
    iVar5 = (int)uVar11;
    if (bVar3 != bVar4) goto LAB_0014fc04;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x20);
  iVar5 = 0;
LAB_0014fc04:
  if (iVar5 == 0) {
    pcStack_160 = (code *)0x14fc17;
    secp256k1_scratch_space_destroy(CTX,scratch);
    return;
  }
  pcStack_160 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  auStack_e10 = (undefined1  [8])0x41;
  psStack_e28 = (secp256k1_scalar *)0x14fc67;
  psStack_188 = scratch;
  psStack_180 = psVar13;
  psStack_178 = psVar12;
  psStack_170 = &local_128;
  sStack_168 = iter;
  pcStack_160 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_c28,&secp256k1_ge_const_g);
  psStack_e28 = (secp256k1_scalar *)0x14fc74;
  secp256k1_gej_set_infinity(&sStack_cc0);
  psStack_e28 = (secp256k1_scalar *)0x14fc8b;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_b90 + 1,(secp256k1_scalar *)psVar8);
  psVar2 = (secp256k1_strauss_point_state *)(asStack_8e0[5].y.n + 3);
  psStack_e28 = (secp256k1_scalar *)0x14fcdd;
  sStack_d58.x.n[0] = (uint64_t)asStack_a60;
  sStack_d58.x.n[1] = (uint64_t)asStack_8e0;
  sStack_d58.x.n[2] = (uint64_t)psVar2;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_d58,&sStack_b90,1,&sStack_c28,
             (secp256k1_scalar *)psVar8,&secp256k1_scalar_zero);
  psStack_e28 = (secp256k1_scalar *)0x14fd0d;
  auStack_e08._0_8_ = asStack_a60;
  auStack_e08._8_8_ = asStack_8e0;
  auStack_e08._16_8_ = psVar2;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_e08,&sStack_d58,1,&sStack_cc0,&secp256k1_scalar_zero
             ,(secp256k1_scalar *)psVar8);
  error_callback = (secp256k1_callback *)0xd0;
  a = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  cbdata = (secp256k1_ge *)0x0;
  psStack_e28 = (secp256k1_scalar *)0x14fd3e;
  ng = (secp256k1_scalar *)psVar8;
  b = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)a,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_8e0[5].y.n + 3),(secp256k1_scalar *)psVar8,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_e28 = (secp256k1_scalar *)0x14fea1;
    test_ecmult_accumulate_cold_8();
LAB_0014fea1:
    psStack_e28 = (secp256k1_scalar *)0x14fea6;
    test_ecmult_accumulate_cold_7();
LAB_0014fea6:
    psStack_e28 = (secp256k1_scalar *)0x14feab;
    test_ecmult_accumulate_cold_6();
LAB_0014feab:
    psStack_e28 = (secp256k1_scalar *)0x14feb0;
    test_ecmult_accumulate_cold_5();
LAB_0014feb0:
    psStack_e28 = (secp256k1_scalar *)0x14feb5;
    test_ecmult_accumulate_cold_4();
LAB_0014feb5:
    psStack_e28 = (secp256k1_scalar *)0x14feba;
    test_ecmult_accumulate_cold_3();
LAB_0014feba:
    psStack_e28 = (secp256k1_scalar *)0x14febf;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    ng = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_e28 = (secp256k1_scalar *)0x14fd79;
    b = scratch_00;
    a = (secp256k1_gej *)error_callback;
    cbdata = psVar8;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_8e0,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar8,1);
    if (iVar5 == 0) goto LAB_0014fea1;
    psStack_e28 = (secp256k1_scalar *)0x14fd98;
    secp256k1_ecmult_const(asStack_a60,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar8);
    psVar8 = (secp256k1_ge *)auStack_e08;
    psStack_e28 = (secp256k1_scalar *)0x14fdad;
    secp256k1_ge_set_gej_var(psVar8,&sStack_b90 + 1);
    a = &sStack_b90;
    psStack_e28 = (secp256k1_scalar *)0x14fdbd;
    b = psVar8;
    iVar5 = secp256k1_gej_eq_ge_var(a,psVar8);
    if (iVar5 == 0) goto LAB_0014fea6;
    a = &sStack_d58;
    b = (secp256k1_ge *)auStack_e08;
    psStack_e28 = (secp256k1_scalar *)0x14fdd7;
    iVar5 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar5 == 0) goto LAB_0014feab;
    a = (secp256k1_gej *)(asStack_8e0[5].y.n + 3);
    b = (secp256k1_ge *)auStack_e08;
    psStack_e28 = (secp256k1_scalar *)0x14fdf1;
    iVar5 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar5 == 0) goto LAB_0014feb0;
    a = asStack_8e0;
    b = (secp256k1_ge *)auStack_e08;
    psStack_e28 = (secp256k1_scalar *)0x14fe0b;
    iVar5 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar5 == 0) goto LAB_0014feb5;
    a = asStack_a60;
    b = (secp256k1_ge *)auStack_e08;
    psStack_e28 = (secp256k1_scalar *)0x14fe25;
    iVar5 = secp256k1_gej_eq_ge_var(a,b);
    if (iVar5 == 0) goto LAB_0014feba;
    psStack_e28 = (secp256k1_scalar *)0x14fe3a;
    secp256k1_ge_verify((secp256k1_ge *)auStack_e08);
    if (auStack_e08._96_4_ != 0) {
      auStack_e08[0x68] = 0;
      sVar10 = 1;
LAB_0014fe80:
      psStack_e28 = (secp256k1_scalar *)0x14fe8a;
      secp256k1_sha256_write(hash,auStack_e08 + 0x68,sVar10);
      return;
    }
    a = (secp256k1_gej *)auStack_e08;
    b = (secp256k1_ge *)(auStack_e08 + 0x68);
    psVar8 = (secp256k1_ge *)auStack_e10;
    ng = (secp256k1_scalar *)0x0;
    psStack_e28 = (secp256k1_scalar *)0x14fe6f;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)a,(uchar *)b,(size_t *)psVar8,0);
    if (auStack_e10 == (undefined1  [8])0x41) {
      sVar10 = 0x41;
      goto LAB_0014fe80;
    }
  }
  psStack_e28 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_e28 = &secp256k1_scalar_zero;
  psStack_e50 = asStack_a60;
  psStack_e48 = error_callback;
  psStack_e38 = psVar8;
  psStack_e30 = psVar2;
  secp256k1_gej_set_infinity(r);
  if ((secp256k1_ge *)ng != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash != (secp256k1_sha256 *)0x0) {
      if (b != (secp256k1_ge *)0x0) {
        sVar10 = secp256k1_pippenger_max_points((secp256k1_callback *)a,(secp256k1_scratch *)b);
        psVar13 = hash;
        if (sVar10 != 0) {
          uVar11 = 5000000;
          if (sVar10 < 5000000) {
            uVar11 = sVar10;
          }
          puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
          uStack_1750 = (ulong)puVar1 / uVar11 + 1;
          psVar13 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_1750 + 1);
        }
        if (sVar10 != 0) {
          if (psVar13 < (secp256k1_sha256 *)0x58) {
            sVar10 = secp256k1_scratch_max_allocation
                               ((secp256k1_callback *)a,(secp256k1_scratch *)b,5);
            if (0x987 < sVar10) {
              uVar11 = sVar10 / 0x988;
              if (4999999 < uVar11) {
                uVar11 = 5000000;
              }
              puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
              uStack_1750 = (ulong)puVar1 / uVar11 + 1;
              psVar13 = (secp256k1_sha256 *)((ulong)puVar1 / uStack_1750 + 1);
            }
            if (sVar10 < 0x988) goto LAB_0015005f;
            pcVar6 = secp256k1_ecmult_strauss_batch;
          }
          else {
            pcVar6 = secp256k1_ecmult_pippenger_batch;
          }
          lVar7 = 0;
          uVar11 = 0;
          while( true ) {
            psVar12 = psVar13;
            if (hash < psVar13) {
              psVar12 = hash;
            }
            psVar8 = (secp256k1_ge *)0x0;
            if (uVar11 == 0) {
              psVar8 = (secp256k1_ge *)ng;
            }
            iVar5 = (*pcVar6)(a,b,&sStack_1728,psVar8,cb,cbdata,psVar12,lVar7);
            if (iVar5 == 0) break;
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1728,(secp256k1_fe *)0x0);
            hash = (secp256k1_sha256 *)((long)hash - (long)psVar12);
            uVar11 = uVar11 + 1;
            lVar7 = (long)psVar13->s + lVar7;
            if (uStack_1750 == uVar11) {
              return;
            }
          }
          return;
        }
      }
LAB_0015005f:
      secp256k1_ecmult_multi_simple_var(r,ng,cb,cbdata,(size_t)hash);
      return;
    }
    sStack_1740.aux = asStack_1318;
    sStack_1740.pre_a = asStack_1198;
    sStack_1740.ps = &sStack_1728;
    secp256k1_ecmult_strauss_wnaf(&sStack_1740,r,1,r,&secp256k1_scalar_zero,ng);
  }
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}